

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::run(CVmImageLoader *this,char **argv,int argc,CVmRuntimeSymbols *global_symtab,
                   CVmRuntimeSymbols *macro_symtab,char *saved_state)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  long *plVar4;
  vm_val_t *pvVar5;
  size_t len;
  CVmRuntimeSymbols *in_RCX;
  int in_EDX;
  long in_RSI;
  CVmImageLoader *in_RDI;
  CVmRuntimeSymbols *in_R8;
  char **in_R9;
  vm_rcdesc rc;
  vm_val_t *strp;
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  size_t slen;
  char argcs [40];
  int i;
  err_frame_t err_cur__;
  int file_path_set;
  char *argstr;
  CCharmapToUni *argmap;
  int entry_code_argc;
  pool_ofs_t entry_code_ofs;
  CVmRuntimeSymbols *orig_runtime_macros;
  CVmRuntimeSymbols *orig_runtime_symtab;
  char *in_stack_fffffffffffffdf8;
  void *pvVar6;
  vm_rcdesc *in_stack_fffffffffffffe00;
  undefined8 uVar7;
  char **in_stack_fffffffffffffe08;
  pool_ofs_t ofs;
  CVmRun *in_stack_fffffffffffffe10;
  CVmImageLoader *in_stack_fffffffffffffe20;
  vm_rcdesc *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe34;
  uchar *in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe44;
  CVmRun *in_stack_fffffffffffffe48;
  CVmImageLoader *in_stack_fffffffffffffe70;
  char local_178 [24];
  char *in_stack_fffffffffffffea0;
  CResLoader *in_stack_fffffffffffffea8;
  int local_144;
  uint local_140 [2];
  undefined8 local_138;
  void *local_130;
  __jmp_buf_tag _Stack_128;
  int local_5c;
  char *local_58;
  CCharmapToUni *local_50;
  int local_48;
  pool_ofs_t local_44;
  CVmRuntimeSymbols *local_40;
  CVmRuntimeSymbols *local_38;
  char **local_30;
  CVmRuntimeSymbols *local_28;
  CVmRuntimeSymbols *local_20;
  int local_14;
  long local_10;
  
  local_50 = (CCharmapToUni *)0x0;
  local_58 = (char *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar1 = (*(in_RDI->pools_[0]->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore[2])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    err_throw(0);
  }
  if (local_30 == (char **)0x0) {
    local_44 = in_RDI->entrypt_;
  }
  else {
    if (G_predef_X.main_restore_func == 0) {
      err_throw(0);
    }
    local_44 = G_predef_X.main_restore_func;
  }
  local_48 = 0;
  local_38 = in_RDI->runtime_symtab_;
  local_40 = in_RDI->runtime_macros_;
  local_5c = 0;
  G_image_loader_X = in_RDI;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_138 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_140;
  local_140[0] = _setjmp(&_Stack_128);
  if (local_140[0] == 0) {
    if (G_file_path_X == (char *)0x0) {
      get_path(in_RDI);
      G_file_path_X = lib_copy_str((char *)in_stack_fffffffffffffe00);
      local_5c = 1;
    }
    if (local_20 != (CVmRuntimeSymbols *)0x0) {
      in_RDI->runtime_symtab_ = local_20;
    }
    if (local_28 != (CVmRuntimeSymbols *)0x0) {
      in_RDI->runtime_macros_ = local_28;
    }
    create_global_symtab_lookup_table(in_stack_fffffffffffffe20);
    if (in_RDI->reflection_symtab_ != 0) {
      pvVar5 = CVmStack::push();
      vm_val_t::set_obj(pvVar5,in_RDI->reflection_symtab_);
    }
    create_macro_symtab_lookup_table(in_stack_fffffffffffffe70);
    if (in_RDI->reflection_macros_ != 0) {
      pvVar5 = CVmStack::push();
      vm_val_t::set_obj(pvVar5,in_RDI->reflection_macros_);
    }
    run_static_init((CVmImageLoader *)err_cur__.jmpbuf_[0].__saved_mask.__val[7]);
    if (local_30 != (char **)0x0) {
      in_stack_fffffffffffffe10 = (CVmRun *)CVmStack::push();
      strlen((char *)local_30);
      vVar2 = CVmObjString::create
                        ((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(char *)local_30,
                         (size_t)in_stack_fffffffffffffe00);
      vm_val_t::set_obj((vm_val_t *)in_stack_fffffffffffffe10,vVar2);
      local_48 = local_48 + 1;
      in_stack_fffffffffffffe08 = local_30;
    }
    if (0 < local_14) {
      if (G_net_config_X == (TadsNetConfig *)0x0) {
        os_get_charmap((char *)in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      }
      else {
        strcpy(local_178,"utf8");
      }
      (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
      local_50 = CCharmapToUni::load(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    }
    for (local_144 = 0; local_144 < local_14; local_144 = local_144 + 1) {
      if (local_50 == (CCharmapToUni *)0x0) {
        len = strlen(*(char **)(local_10 + (long)local_144 * 8));
        local_58 = (char *)malloc(len + 1);
        memcpy(local_58,*(void **)(local_10 + (long)local_144 * 8),len + 1);
        CCharmapToUni::validate(local_58,len);
      }
      else {
        CCharmapToUni::map_str_alo
                  ((CCharmapToUni *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (char *)in_stack_fffffffffffffe00);
      }
      CVmRun::push_string(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
                          (size_t)in_stack_fffffffffffffe00);
      free(local_58);
      local_58 = (char *)0x0;
    }
    vVar2 = CVmObjList::create((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                               (size_t)in_stack_fffffffffffffdf8);
    vm_objp(0);
    for (local_144 = 0; ofs = (pool_ofs_t)((ulong)in_stack_fffffffffffffe08 >> 0x20),
        local_144 < local_14; local_144 = local_144 + 1) {
      CVmStack::get((long)((local_14 - local_144) + -1));
      CVmObjList::cons_set_element
                ((CVmObjList *)in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8,
                 (vm_val_t *)0x3607f1);
    }
    CVmStack::discard(local_14);
    pvVar5 = CVmStack::push();
    vm_val_t::set_obj(pvVar5,vVar2);
    local_48 = local_48 + 1;
    pvVar5 = CVmStack::push();
    vm_val_t::set_propid(pvVar5,0);
    pvVar5 = CVmStack::push();
    vm_val_t::set_nil(pvVar5);
    pvVar5 = CVmStack::push();
    vm_val_t::set_nil(pvVar5);
    pvVar5 = CVmStack::push();
    vm_val_t::set_nil_obj(pvVar5);
    pvVar5 = CVmStack::push();
    vm_val_t::set_fnptr(pvVar5,local_44);
    vm_rcdesc::vm_rcdesc(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    CVmPoolInMem::get_ptr((CVmPoolInMem *)in_stack_fffffffffffffe10,ofs);
    CVmRun::do_call(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
    if (in_RDI->reflection_macros_ != 0) {
      CVmStack::discard();
    }
    if (in_RDI->reflection_symtab_ != 0) {
      CVmStack::discard();
    }
  }
  if ((local_140[0] & 0x8000) == 0) {
    local_140[0] = local_140[0] | 0x8000;
    G_image_loader_X = (CVmImageLoader *)0x0;
    in_RDI->runtime_symtab_ = local_38;
    in_RDI->runtime_macros_ = local_40;
    if (local_50 != (CCharmapToUni *)0x0) {
      CCharmap::release_ref((CCharmap *)in_stack_fffffffffffffe00);
    }
    if (local_58 != (char *)0x0) {
      free(local_58);
    }
    if (local_5c != 0) {
      lib_free_str((char *)0x36097f);
      G_file_path_X = (char *)0x0;
    }
  }
  uVar7 = local_138;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar7;
  if ((local_140[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar6 = local_130;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar6;
    err_rethrow();
  }
  if ((local_140[0] & 2) != 0) {
    free(local_130);
  }
  return;
}

Assistant:

void CVmImageLoader::run(VMG_ const char *const *argv, int argc,
                         CVmRuntimeSymbols *global_symtab,
                         CVmRuntimeSymbols *macro_symtab,
                         const char *saved_state)
{
    CVmRuntimeSymbols *orig_runtime_symtab, *orig_runtime_macros;
    pool_ofs_t entry_code_ofs;
    int entry_code_argc;
    CCharmapToUni *argmap = 0;
    char *argstr = 0;
    
    /* make sure we found a code pool definition */
    if (pools_[0]->vmpbs_get_page_count() < 1)
        err_throw(VMERR_IMAGE_NO_CODE);

    /* 
     *   Find the entrypoint.  If we have a saved state, call the function
     *   given by the exported symbol "mainRestore".  Otherwise, call the
     *   exported main entrypoint function.  
     */
    if (saved_state != 0)
    {
        /* 
         *   We're restoring a saved state file immediately on startup - call
         *   the exported "mainRestore" function.  If there is no such
         *   export, we can't run the program with an initial saved state.  
         */
        if (G_predef->main_restore_func == 0)
            err_throw(VMERR_NO_MAINRESTORE);

        /* use the mainRestore export */
        entry_code_ofs = G_predef->main_restore_func;
    }
    else
    {
        /* ordinary startup - use the exported primary entrypoint */
        entry_code_ofs = entrypt_;
    }

    /* we have no arguments to the entrypoint function yet */
    entry_code_argc = 0;

    /* set myself as the global image loader */
    G_image_loader = this;

    /* remember the original runtime symbol table */
    orig_runtime_symtab = runtime_symtab_;
    orig_runtime_macros = runtime_macros_;

    /* we haven't set the file path */
    int file_path_set = FALSE;

    /* catch any errors so we restore globals on the way out */
    err_try
    {
        int i;
        
        /* if there's no file path, use the image file folder by default */
        if (G_file_path == 0)
        {
            G_file_path = lib_copy_str(get_path());
            file_path_set = TRUE;
        }

        /* 
         *   if the caller gave us a runtime symbol table, use it over any
         *   we have already stored 
         */
        if (global_symtab != 0)
            runtime_symtab_ = global_symtab;
        if (macro_symtab != 0)
            runtime_macros_ = macro_symtab;

        /* create a LookupTable for the reflection symbols, if any */
        create_global_symtab_lookup_table(vmg0_);

        /* 
         *   if we successfully created a reflection symbol table, push it
         *   onto the stack - this will ensure that the object won't be
         *   discarded as long as the program is running 
         */
        if (reflection_symtab_ != VM_INVALID_OBJ)
        {
            /* set up an object value for the table and push it */
            G_stk->push()->set_obj(reflection_symtab_);
        }

        /* create and stack the reflection LookupTable for macros */
        create_macro_symtab_lookup_table(vmg0_);
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->push()->set_obj(reflection_macros_);

        /* 
         *   run static initializers (do this after creating the symbol
         *   table, in case any of the initializers want to access the
         *   symbol table) 
         */
        run_static_init(vmg0_);

        /* if there's a saved state file to restore, push it */
        if (saved_state != 0)
        {
            /* create a string object for the filename, and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE,
                                     saved_state, strlen(saved_state)));

            /* count the extra startup argument */
            ++entry_code_argc;
        }

        /* get a character mapper for the command-line arguments */
        if (argc > 0)
        {
            /* 
             *   If we have a net configuration, assume that the arguments
             *   are in UTF-8 format, since they're coming from a web server.
             *   Otherwise, ask the OS which character set to use for
             *   command-line parameters.
             */
            char argcs[40];
            if (G_net_config != 0)
                strcpy(argcs, "utf8");
            else
                os_get_charmap(argcs, OS_CHARMAP_CMDLINE);

            /* load the character set */
            argmap = CCharmapToUni::load(
                G_host_ifc->get_sys_res_loader(), argcs);
        }

        /* 
         *   push a string object for each argument - push them onto the
         *   stack to ensure that they're referenced in case garbage
         *   collection occurs while we're working 
         */
        for (i = 0 ; i < argc ; ++i)
        {
            /* if we have a character mapper, map the argument string */
            size_t slen;
            if (argmap != 0)
            {
                /* map the argument to UTF8 */
                slen = argmap->map_str_alo(&argstr, argv[i]);
            }
            else
            {
                /* make a copy of the string */
                slen = strlen(argv[i]);
                argstr = (char *)t3malloc(slen + 1);
                memcpy(argstr, argv[i], slen + 1);

                /* make sure it's well-formed UTF-8 */
                CCharmapToUni::validate(argstr, slen);
            }

            /* push the mapped/adjusted string argument */
            G_interpreter->push_string(vmg_ argstr, slen);

            /* done with the mapped/adjusted string */
            t3free(argstr);
            argstr = 0;
        }

        /* create a list to hold the strings */
        vm_obj_id_t lst_obj = CVmObjList::create(vmg_ FALSE, argc);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list elements to the strings */
        for (i = 0 ; i < argc ; ++i)
        {
            vm_val_t *strp;
            
            /* 
             *   Get this item from the stack.  Note that the most recently
             *   pushed item is number 0, then number 1, and so on - the
             *   last argument string (at index argc) is thus number 0, and
             *   the first (at index 0) is number argc.  
             */
            strp = G_stk->get(argc - i - 1);

            /* set this list element */
            lst->cons_set_element(i, strp);
        }

        /* 
         *   we don't need the strings themselves any more, as we can reach
         *   them through the list, so drop the strings from the stack 
         */
        G_stk->discard(argc);
        
        /* push the list - it's the argument to the program entrypoint */
        G_stk->push()->set_obj(lst_obj);
        ++entry_code_argc;

        /* 
         *   Invoke the entrypoint function - it takes two arguments (the
         *   list of argument strings, and the name of the initial saved
         *   state file to restore, if any).  
         */
        G_stk->push()->set_propid(VM_INVALID_PROP);
        G_stk->push()->set_nil();
        G_stk->push()->set_nil();
        G_stk->push()->set_nil_obj();
        G_stk->push()->set_fnptr(entry_code_ofs);
        vm_rcdesc rc("Main entrypoint");
        G_interpreter->do_call(
            vmg_ 0,
            (const uchar *)G_code_pool->get_ptr(entry_code_ofs),
            entry_code_argc, &rc);

        /* 
         *   if we pushed a global symbol table LookupTable object, pop it -
         *   we left it on the stack to protect it from the garbage
         *   collector, since it's always implicitly referenced from the
         *   intrinsic function that retrieves the symbol table object 
         */
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->discard();
        if (reflection_symtab_ != VM_INVALID_OBJ)
            G_stk->discard();
    }